

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_31::WebSocketImpl::receive(WebSocketImpl *this)

{
  ulong uVar1;
  Disposer *pDVar2;
  undefined1 uVar3;
  Array<unsigned_char> *__begin4;
  _func_int *p_Var4;
  ArrayDisposer *pAVar5;
  TransformPromiseNodeBase *pTVar6;
  byte bVar7;
  _func_int *p_Var8;
  ChainPromiseNode *pCVar9;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  ChainPromiseNode *extraout_RDX_01;
  ChainPromiseNode *extraout_RDX_02;
  ChainPromiseNode *extraout_RDX_03;
  ChainPromiseNode *extraout_RDX_04;
  Array<unsigned_char> *fragment_1;
  ArrayDisposer *__dest;
  _func_int **in_RSI;
  _func_int *__src;
  long lVar10;
  PromiseNode *pPVar11;
  PromiseNode *pPVar12;
  _func_int **pp_Var13;
  Own<kj::_::ChainPromiseNode> OVar14;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> PVar15;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2197:17),_unsigned_long>
  promise;
  Fault f;
  byte local_d9;
  Own<kj::_::PromiseNode> local_d8;
  Own<kj::_::PromiseNode> local_c8;
  undefined8 *local_b8;
  Own<kj::_::PromiseNode> local_b0;
  Own<kj::_::PromiseNode> local_a0;
  WebSocketImpl *local_90;
  Array<unsigned_char> local_88;
  PromiseNode *pPStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  ArrayDisposer *local_60;
  PromiseNode *pPStack_58;
  undefined8 *local_50;
  _func_int *local_48;
  ArrayBuilder<kj::Array<unsigned_char>_> *local_40;
  PromiseNode *local_38;
  
  __src = in_RSI[0x1a];
  p_Var8 = in_RSI[0x1b];
  p_Var4 = (_func_int *)0x2;
  if ((_func_int *)0x1 < p_Var8) {
    lVar10 = (ulong)((byte)__src[1] >> 7) * 4;
    p_Var4 = (_func_int *)(lVar10 + 2);
    bVar7 = (byte)__src[1] & 0x7f;
    if (bVar7 == 0x7e) {
      p_Var4 = (_func_int *)(lVar10 + 4);
    }
    else if (bVar7 == 0x7f) {
      p_Var4 = (_func_int *)((ulong)p_Var4 | 8);
    }
  }
  if (p_Var8 < p_Var4) {
    p_Var4 = in_RSI[0x17];
    if (__src != p_Var4) {
      if (p_Var8 == (_func_int *)0x0) {
        p_Var8 = (_func_int *)0x0;
      }
      else {
        memmove(p_Var4,__src,(size_t)p_Var8);
        p_Var4 = in_RSI[0x17];
        p_Var8 = in_RSI[0x1b];
      }
      in_RSI[0x1a] = p_Var4;
      in_RSI[0x1b] = p_Var8;
      __src = p_Var4;
    }
    (**(code **)(*(long *)in_RSI[2] + 8))
              (&local_d8,in_RSI[2],__src + (long)p_Var8,1,
               (long)(p_Var4 + (long)in_RSI[0x18]) - (long)(__src + (long)p_Var8));
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_d8,
               _::
               TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2069:17),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00442a88;
    pTVar6[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
    local_c8.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>,unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_c8.ptr = (PromiseNode *)pTVar6;
    OVar14 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_88,&local_c8);
    pPVar12 = local_c8.ptr;
    pCVar9 = OVar14.ptr;
    *(undefined4 *)&(this->super_WebSocket)._vptr_WebSocket = local_88.ptr._0_4_;
    *(undefined4 *)((long)&(this->super_WebSocket)._vptr_WebSocket + 4) = local_88.ptr._4_4_;
    *(undefined4 *)&(this->stream).disposer = (undefined4)local_88.size_;
    *(undefined4 *)((long)&(this->stream).disposer + 4) = local_88.size_._4_4_;
    if ((TransformPromiseNodeBase *)local_c8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_c8.ptr = (PromiseNode *)0x0;
      (**(local_c8.disposer)->_vptr_Disposer)
                (local_c8.disposer,
                 ((PromiseNode *)&pPVar12->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar12->_vptr_PromiseNode)->_vptr_PromiseNode);
      pCVar9 = extraout_RDX;
    }
    pPVar12 = local_d8.ptr;
    if (local_d8.ptr != (PromiseNode *)0x0) {
      local_d8.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_d8.disposer._4_4_,local_d8.disposer._0_4_))
                ((undefined8 *)CONCAT44(local_d8.disposer._4_4_,local_d8.disposer._0_4_),
                 pPVar12->_vptr_PromiseNode[-2] + (long)&pPVar12->_vptr_PromiseNode);
      pCVar9 = extraout_RDX_00;
    }
    goto LAB_002bf3d5;
  }
  in_RSI[0x1a] = __src + (long)p_Var4;
  in_RSI[0x1b] = p_Var8 + -(long)p_Var4;
  pPVar12 = (PromiseNode *)(ulong)((byte)__src[1] & 0x7f);
  if (pPVar12 == (PromiseNode *)0x7e) {
    pPVar12 = (PromiseNode *)
              (ulong)(ushort)(*(ushort *)(__src + 2) << 8 | *(ushort *)(__src + 2) >> 8);
  }
  else if (((byte)__src[1] & 0x7f) == 0x7f) {
    uVar1 = *(ulong *)(__src + 2);
    pPVar12 = (PromiseNode *)
              (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
               | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
               (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
  }
  bVar7 = (byte)*__src;
  local_d9 = bVar7 & 0xf;
  pPVar11 = pPVar12;
  local_90 = this;
  if ((bVar7 & 0xf) == 0) {
    p_Var4 = in_RSI[0x13];
    p_Var8 = in_RSI[0x14];
    if (p_Var8 == p_Var4) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                ((Fault *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x82e,FAILED,"!fragments.empty()","\"unexpected continuation frame in WebSocket\""
                 ,(char (*) [43])"unexpected continuation frame in WebSocket");
      _::Debug::Fault::fatal((Fault *)&local_88);
    }
    local_d9 = *(byte *)(in_RSI + 0x12);
LAB_002bee84:
    local_c8.disposer = (Disposer *)0x0;
    local_c8.ptr = (PromiseNode *)0x0;
    local_b8 = (undefined8 *)0x0;
    if (-1 < (char)bVar7) {
      pAVar5 = (ArrayDisposer *)
               _::HeapArrayDisposer::allocateImpl
                         (1,(size_t)pPVar12,(size_t)pPVar12,(_func_void_void_ptr *)0x0,
                          (_func_void_void_ptr *)0x0);
      if (in_RSI[0x14] == in_RSI[0x13]) {
        *(uint *)(in_RSI + 0x12) = (uint)local_d9;
      }
      uVar3 = 0;
      goto LAB_002bf12b;
    }
    pPVar11 = (PromiseNode *)((long)&pPVar12->_vptr_PromiseNode + (ulong)(local_d9 == 1));
    if (p_Var8 == p_Var4) goto LAB_002bf100;
    local_40 = (ArrayBuilder<kj::Array<unsigned_char>_> *)(in_RSI + 0x13);
    lVar10 = 0;
    do {
      lVar10 = lVar10 + *(long *)(p_Var4 + 8);
      p_Var4 = p_Var4 + 0x18;
    } while (p_Var4 != p_Var8);
    pPVar11 = (PromiseNode *)((long)&pPVar11->_vptr_PromiseNode + lVar10);
    local_38 = pPVar12;
    pAVar5 = (ArrayDisposer *)
             _::HeapArrayDisposer::allocateImpl
                       (1,(size_t)pPVar11,(size_t)pPVar11,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    p_Var4 = in_RSI[0x13];
    p_Var8 = in_RSI[0x14];
    local_b8 = &_::HeapArrayDisposer::instance;
    lVar10 = 0;
    local_c8.disposer = (Disposer *)pAVar5;
    local_48 = __src;
    for (; p_Var4 != p_Var8; p_Var4 = p_Var4 + 0x18) {
      memcpy((void *)((long)&pAVar5->_vptr_ArrayDisposer + lVar10),*(void **)p_Var4,
             *(size_t *)(p_Var4 + 8));
      lVar10 = lVar10 + *(long *)(p_Var4 + 8);
    }
    ArrayBuilder<kj::Array<unsigned_char>_>::clear(local_40);
    __dest = (ArrayDisposer *)((long)&pAVar5->_vptr_ArrayDisposer + lVar10);
    *(undefined4 *)(in_RSI + 0x12) = 0;
    uVar3 = 1;
    __src = local_48;
    pPVar12 = local_38;
  }
  else {
    if ((bVar7 & 0xf) < 8) {
      p_Var4 = in_RSI[0x13];
      p_Var8 = in_RSI[0x14];
      if (p_Var8 != p_Var4) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                  ((Fault *)&local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x832,FAILED,"fragments.empty()","\"expected continuation frame in WebSocket\"",
                   (char (*) [41])0x3a076d);
        _::Debug::Fault::fatal((Fault *)&local_88);
      }
      goto LAB_002bee84;
    }
    local_c8.disposer = (Disposer *)0x0;
    local_c8.ptr = (PromiseNode *)0x0;
    local_b8 = (undefined8 *)0x0;
    if (-1 < (char)bVar7) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                ((Fault *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x853,FAILED,"isData","\"WebSocket control frame cannot be fragmented\"",
                 (char (*) [45])"WebSocket control frame cannot be fragmented");
      _::Debug::Fault::fatal((Fault *)&local_88);
    }
LAB_002bf100:
    local_b8 = (undefined8 *)0x0;
    local_c8.ptr = (PromiseNode *)0x0;
    local_c8.disposer = (Disposer *)0x0;
    pAVar5 = (ArrayDisposer *)
             _::HeapArrayDisposer::allocateImpl
                       (1,(size_t)pPVar11,(size_t)pPVar11,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    uVar3 = 1;
LAB_002bf12b:
    local_b8 = &_::HeapArrayDisposer::instance;
    __dest = pAVar5;
  }
  local_68 = 0;
  if ((char)__src[1] < '\0') {
    bVar7 = (byte)__src[1] & 0x7f;
    lVar10 = 10;
    if (bVar7 != 0x7f) {
      lVar10 = (ulong)(bVar7 == 0x7e) * 2 + 2;
    }
    local_68 = *(undefined4 *)(__src + lVar10);
  }
  local_88.size_._0_4_ = CONCAT31(local_88.size_._1_3_,local_d9);
  uStack_64 = CONCAT31(uStack_64._1_3_,uVar3);
  local_50 = &_::HeapArrayDisposer::instance;
  local_c8.disposer = (Disposer *)0x0;
  local_c8.ptr = (PromiseNode *)0x0;
  local_88.disposer = __dest;
  pPStack_70 = pPVar12;
  local_60 = pAVar5;
  pPStack_58 = pPVar11;
  if ((PromiseNode *)in_RSI[0x1b] < pPVar12) {
    local_88.ptr = (uchar *)in_RSI;
    memcpy(__dest,in_RSI[0x1a],(size_t)in_RSI[0x1b]);
    pp_Var13 = (_func_int **)((long)pPVar12 - (long)in_RSI[0x1b]);
    (**(code **)(*(long *)in_RSI[2] + 8))
              (&local_d8,in_RSI[2],
               (_func_int *)((long)&__dest->_vptr_ArrayDisposer + (long)in_RSI[0x1b]),pp_Var13,
               pp_Var13);
    this = local_90;
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_d8,
               _::
               TransformPromiseNode<kj::_::Void,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2197:17),_kj::_::PropagateException>
               ::anon_class_8_1_49713496_for_func::operator());
    pPVar12 = local_d8.ptr;
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00442b10;
    pTVar6[1].super_PromiseNode._vptr_PromiseNode = pp_Var13;
    local_b0.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(unsigned_long)#2},kj::_::PropagateException>>
          ::instance;
    local_b0.ptr = (PromiseNode *)pTVar6;
    if (local_d8.ptr != (PromiseNode *)0x0) {
      local_d8.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_d8.disposer._4_4_,local_d8.disposer._0_4_))
                ((undefined8 *)CONCAT44(local_d8.disposer._4_4_,local_d8.disposer._0_4_),
                 pPVar12->_vptr_PromiseNode[-2] + (long)&pPVar12->_vptr_PromiseNode);
    }
    in_RSI[0x1a] = (_func_int *)0x0;
    in_RSI[0x1b] = (_func_int *)0x0;
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x68);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_b0,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2144:9),_kj::Array<unsigned_char>_>
               ::operator()<>);
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00442b98;
    pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_88.ptr;
    pTVar6[1].dependency.disposer =
         (Disposer *)CONCAT44(local_88.size_._4_4_,(undefined4)local_88.size_);
    pTVar6[1].dependency.ptr = (PromiseNode *)local_88.disposer;
    pTVar6[1].continuationTracePtr = pPStack_70;
    pTVar6[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)CONCAT44(uStack_64,local_68);
    pTVar6[2].dependency.disposer = (Disposer *)local_60;
    pTVar6[2].dependency.ptr = pPStack_58;
    pTVar6[2].continuationTracePtr = local_50;
    local_60 = (ArrayDisposer *)0x0;
    pPStack_58 = (PromiseNode *)0x0;
    local_a0.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(kj::Array<unsigned_char>&&)#1},kj::Array<unsigned_char>>,kj::_::PropagateException>>
          ::instance;
    local_a0.ptr = (PromiseNode *)pTVar6;
    OVar14 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_d8,&local_a0);
    pPVar12 = local_a0.ptr;
    pCVar9 = OVar14.ptr;
    *(undefined4 *)&(this->super_WebSocket)._vptr_WebSocket = local_d8.disposer._0_4_;
    *(undefined4 *)((long)&(this->super_WebSocket)._vptr_WebSocket + 4) = local_d8.disposer._4_4_;
    *(undefined4 *)&(this->stream).disposer = local_d8.ptr._0_4_;
    *(undefined4 *)((long)&(this->stream).disposer + 4) = local_d8.ptr._4_4_;
    if ((TransformPromiseNodeBase *)local_a0.ptr != (TransformPromiseNodeBase *)0x0) {
      local_a0.ptr = (PromiseNode *)0x0;
      (**(local_a0.disposer)->_vptr_Disposer)
                (local_a0.disposer,
                 ((PromiseNode *)&pPVar12->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar12->_vptr_PromiseNode)->_vptr_PromiseNode);
      pCVar9 = extraout_RDX_01;
    }
    pPVar12 = local_b0.ptr;
    if ((TransformPromiseNodeBase *)local_b0.ptr != (TransformPromiseNodeBase *)0x0) {
      local_b0.ptr = (PromiseNode *)0x0;
      (**(local_b0.disposer)->_vptr_Disposer)
                (local_b0.disposer,
                 ((PromiseNode *)&pPVar12->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar12->_vptr_PromiseNode)->_vptr_PromiseNode);
      pCVar9 = extraout_RDX_02;
    }
  }
  else {
    memcpy(__dest,in_RSI[0x1a],(size_t)pPVar12);
    this = local_90;
    in_RSI[0x1a] = (_func_int *)((long)&pPVar12->_vptr_PromiseNode + (long)in_RSI[0x1a]);
    in_RSI[0x1b] = in_RSI[0x1b] + -(long)pPVar12;
    PVar15 = CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2144:9),_kj::Array<unsigned_char>_>
             ::anon_class_40_6_f6836660_for_func::operator()
                       ((anon_class_40_6_f6836660_for_func *)local_90,&local_88);
    pPVar12 = pPStack_58;
    pAVar5 = local_60;
    pCVar9 = PVar15.super_PromiseBase.node.ptr;
    if (local_60 != (ArrayDisposer *)0x0) {
      local_60 = (ArrayDisposer *)0x0;
      pPStack_58 = (PromiseNode *)0x0;
      (**(code **)*local_50)(local_50,pAVar5,1,pPVar12,pPVar12,0);
      pCVar9 = extraout_RDX_03;
    }
  }
  pPVar12 = local_c8.ptr;
  pDVar2 = local_c8.disposer;
  if (local_c8.disposer != (Disposer *)0x0) {
    local_c8.disposer = (Disposer *)0x0;
    local_c8.ptr = (PromiseNode *)0x0;
    (**(code **)*local_b8)(local_b8,pDVar2,1,pPVar12,pPVar12,0);
    pCVar9 = extraout_RDX_04;
  }
LAB_002bf3d5:
  PVar15.super_PromiseBase.node.ptr = &pCVar9->super_PromiseNode;
  PVar15.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         PVar15.super_PromiseBase.node;
}

Assistant:

kj::Promise<Message> receive() override {
    size_t headerSize = Header::headerSize(recvData.begin(), recvData.size());

    if (headerSize > recvData.size()) {
      if (recvData.begin() != recvBuffer.begin()) {
        // Move existing data to front of buffer.
        if (recvData.size() > 0) {
          memmove(recvBuffer.begin(), recvData.begin(), recvData.size());
        }
        recvData = recvBuffer.slice(0, recvData.size());
      }

      return stream->tryRead(recvData.end(), 1, recvBuffer.end() - recvData.end())
          .then([this](size_t actual) -> kj::Promise<Message> {
        if (actual == 0) {
          if (recvData.size() > 0) {
            return KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in frame header");
          } else {
            // It's incorrect for the WebSocket to disconnect without sending `Close`.
            return KJ_EXCEPTION(DISCONNECTED,
                "WebSocket disconnected between frames without sending `Close`.");
          }
        }

        recvData = recvBuffer.slice(0, recvData.size() + actual);
        return receive();
      });
    }

    auto& recvHeader = *reinterpret_cast<Header*>(recvData.begin());

    recvData = recvData.slice(headerSize, recvData.size());

    size_t payloadLen = recvHeader.getPayloadLen();

    auto opcode = recvHeader.getOpcode();
    bool isData = opcode < OPCODE_FIRST_CONTROL;
    if (opcode == OPCODE_CONTINUATION) {
      KJ_REQUIRE(!fragments.empty(), "unexpected continuation frame in WebSocket");

      opcode = fragmentOpcode;
    } else if (isData) {
      KJ_REQUIRE(fragments.empty(), "expected continuation frame in WebSocket");
    }

    bool isFin = recvHeader.isFin();

    kj::Array<byte> message;           // space to allocate
    byte* payloadTarget;               // location into which to read payload (size is payloadLen)
    if (isFin) {
      // Add space for NUL terminator when allocating text message.
      size_t amountToAllocate = payloadLen + (opcode == OPCODE_TEXT && isFin);

      if (isData && !fragments.empty()) {
        // Final frame of a fragmented message. Gather the fragments.
        size_t offset = 0;
        for (auto& fragment: fragments) offset += fragment.size();
        message = kj::heapArray<byte>(offset + amountToAllocate);

        offset = 0;
        for (auto& fragment: fragments) {
          memcpy(message.begin() + offset, fragment.begin(), fragment.size());
          offset += fragment.size();
        }
        payloadTarget = message.begin() + offset;

        fragments.clear();
        fragmentOpcode = 0;
      } else {
        // Single-frame message.
        message = kj::heapArray<byte>(amountToAllocate);
        payloadTarget = message.begin();
      }
    } else {
      // Fragmented message, and this isn't the final fragment.
      KJ_REQUIRE(isData, "WebSocket control frame cannot be fragmented");

      message = kj::heapArray<byte>(payloadLen);
      payloadTarget = message.begin();
      if (fragments.empty()) {
        // This is the first fragment, so set the opcode.
        fragmentOpcode = opcode;
      }
    }

    Mask mask = recvHeader.getMask();

    auto handleMessage = kj::mvCapture(message,
        [this,opcode,payloadTarget,payloadLen,mask,isFin]
        (kj::Array<byte>&& message) -> kj::Promise<Message> {
      if (!mask.isZero()) {
        mask.apply(kj::arrayPtr(payloadTarget, payloadLen));
      }

      if (!isFin) {
        // Add fragment to the list and loop.
        fragments.add(kj::mv(message));
        return receive();
      }

      switch (opcode) {
        case OPCODE_CONTINUATION:
          // Shouldn't get here; handled above.
          KJ_UNREACHABLE;
        case OPCODE_TEXT:
          message.back() = '\0';
          return Message(kj::String(message.releaseAsChars()));
        case OPCODE_BINARY:
          return Message(message.releaseAsBytes());
        case OPCODE_CLOSE:
          if (message.size() < 2) {
            return Message(Close { 1005, nullptr });
          } else {
            uint16_t status = (static_cast<uint16_t>(message[0]) << 8)
                            | (static_cast<uint16_t>(message[1])     );
            return Message(Close {
              status, kj::heapString(message.slice(2, message.size()).asChars())
            });
          }
        case OPCODE_PING:
          // Send back a pong.
          queuePong(kj::mv(message));
          return receive();
        case OPCODE_PONG:
          // Unsolicited pong. Ignore.
          return receive();
        default:
          KJ_FAIL_REQUIRE("unknown WebSocket opcode", opcode);
      }
    });

    if (payloadLen <= recvData.size()) {
      // All data already received.
      memcpy(payloadTarget, recvData.begin(), payloadLen);
      recvData = recvData.slice(payloadLen, recvData.size());
      return handleMessage();
    } else {
      // Need to read more data.
      memcpy(payloadTarget, recvData.begin(), recvData.size());
      size_t remaining = payloadLen - recvData.size();
      auto promise = stream->tryRead(payloadTarget + recvData.size(), remaining, remaining)
          .then([remaining](size_t amount) {
        if (amount < remaining) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in message"));
        }
      });
      recvData = nullptr;
      return promise.then(kj::mv(handleMessage));
    }
  }